

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  int iVar1;
  ExtensionRange *pEVar2;
  int local_20;
  int i;
  int number_local;
  Descriptor *this_local;
  
  local_20 = 0;
  do {
    iVar1 = extension_range_count(this);
    if (iVar1 <= local_20) {
      return (ExtensionRange *)0x0;
    }
    pEVar2 = extension_range(this,local_20);
    iVar1 = ExtensionRange::start_number(pEVar2);
    if (iVar1 <= number) {
      pEVar2 = extension_range(this,local_20);
      iVar1 = ExtensionRange::end_number(pEVar2);
      if (number < iVar1) {
        pEVar2 = extension_range(this,local_20);
        return pEVar2;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start_number() &&
        number < extension_range(i)->end_number()) {
      return extension_range(i);
    }
  }
  return nullptr;
}